

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void first_valueFinalizeFunc(sqlite3_context *pCtx)

{
  void *pvVar1;
  
  pvVar1 = sqlite3_aggregate_context(pCtx,0x10);
  if ((pvVar1 != (void *)0x0) && (*(sqlite3_value **)((long)pvVar1 + 8) != (sqlite3_value *)0x0)) {
    sqlite3_result_value(pCtx,*(sqlite3_value **)((long)pvVar1 + 8));
    sqlite3ValueFree(*(sqlite3_value **)((long)pvVar1 + 8));
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  return;
}

Assistant:

static void first_valueFinalizeFunc(sqlite3_context *pCtx){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pValue ){
    sqlite3_result_value(pCtx, p->pValue);
    sqlite3_value_free(p->pValue);
    p->pValue = 0;
  }
}